

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall ui::anon_unknown_1::PanelAdapter::~PanelAdapter(PanelAdapter *this)

{
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__PanelAdapter_00167d40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->panel_).super___shared_ptr<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->title_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ftxui::ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

PanelAdapter(Panel panel) : panel_(panel) {
    title_ = Renderer([&](bool focused) {
      auto style = focused ? inverted : nothing;
      return text(panel_->Title()) | style;
    });

    Add(Container::Vertical({
        title_,
        panel_,
    }));
  }